

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

int __thiscall
kratos::CommentStmt::clone
          (CommentStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  element_type *peVar1;
  shared_ptr<kratos::Stmt> local_60 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  undefined1 local_28 [8];
  shared_ptr<kratos::CommentStmt> stmt;
  CommentStmt *this_local;
  
  stmt.super___shared_ptr<kratos::CommentStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  std::make_shared<kratos::CommentStmt>();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_40,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(__fn + 0xc0));
  peVar1 = std::__shared_ptr_access<kratos::CommentStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::CommentStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&peVar1->comments_,&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::CommentStmt,void>
            (local_60,(shared_ptr<kratos::CommentStmt> *)local_28);
  Stmt::copy_meta((Stmt *)__fn,local_60);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(local_60);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::CommentStmt,void>
            ((shared_ptr<kratos::Stmt> *)this,(shared_ptr<kratos::CommentStmt> *)local_28);
  std::shared_ptr<kratos::CommentStmt>::~shared_ptr((shared_ptr<kratos::CommentStmt> *)local_28);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> CommentStmt::clone() const {
    auto stmt = std::make_shared<CommentStmt>();
    stmt->comments_ = std::vector(comments_);
    copy_meta(stmt);
    return stmt;
}